

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O2

void __thiscall FirewirePort::Cleanup(FirewirePort *this)

{
  __normal_iterator<FirewirePort_**,_std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>_>
  __position;
  ostream *poVar1;
  
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<FirewirePort**,std::vector<FirewirePort*,std::allocator<FirewirePort*>>>,__gnu_cxx::__ops::_Iter_equals_val<FirewirePort*const>>
                         (PortList.
                          super__Vector_base<FirewirePort_*,_std::allocator<FirewirePort_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          PortList.
                          super__Vector_base<FirewirePort_*,_std::allocator<FirewirePort_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
  if (__position._M_current ==
      PortList.super__Vector_base<FirewirePort_*,_std::allocator<FirewirePort_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar1 = std::operator<<((this->super_BasePort).outStr,
                             "FirewirePort::Cleanup: could not find entry for port ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_BasePort).PortNum);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    std::vector<FirewirePort_*,_std::allocator<FirewirePort_*>_>::erase
              (&PortList,(const_iterator)__position._M_current);
  }
  raw1394_destroy_handle(this->handle);
  this->handle = (raw1394handle_t)0x0;
  return;
}

Assistant:

void FirewirePort::Cleanup(void)
{
    PortListType::iterator it = std::find(PortList.begin(), PortList.end(), this);
    if (it == PortList.end())
        outStr << "FirewirePort::Cleanup: could not find entry for port " << PortNum << std::endl;
    else
        PortList.erase(it);
    raw1394_destroy_handle(handle);
    handle = NULL;
}